

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hair_geometry_device.h
# Opt level: O2

void embree::TutorialData_Constructor(TutorialData *This)

{
  undefined8 uVar1;
  
  This->scene = (RTCScene)0x0;
  This->traversable = (RTCTraversable)0x0;
  This->ispc_scene = g_ispc_scene;
  uVar1 = g_dirlight_direction.field_0._8_8_;
  *(undefined8 *)&(This->dirlight_direction).field_0 = g_dirlight_direction.field_0._0_8_;
  *(undefined8 *)((long)&(This->dirlight_direction).field_0 + 8) = uVar1;
  uVar1 = g_dirlight_intensity.field_0._8_8_;
  *(undefined8 *)&(This->dirlight_intensity).field_0 = g_dirlight_intensity.field_0._0_8_;
  *(undefined8 *)((long)&(This->dirlight_intensity).field_0 + 8) = uVar1;
  uVar1 = g_ambient_intensity.field_0._8_8_;
  *(undefined8 *)&(This->ambient_intensity).field_0 = g_ambient_intensity.field_0._0_8_;
  *(undefined8 *)((long)&(This->ambient_intensity).field_0 + 8) = uVar1;
  This->accu = (Vec3ff *)0x0;
  This->accu_width = 0;
  This->accu_height = 0;
  This->accu_count = 0;
  *(undefined8 *)&(This->accu_vx).field_0 = 0;
  *(undefined8 *)((long)&(This->accu_vx).field_0 + 8) = 0;
  *(undefined8 *)&(This->accu_vy).field_0 = 0;
  *(undefined8 *)((long)&(This->accu_vy).field_0 + 8) = 0;
  *(undefined8 *)&(This->accu_vz).field_0 = 0;
  *(undefined8 *)((long)&(This->accu_vz).field_0 + 8) = 0;
  *(undefined8 *)&(This->accu_p).field_0 = 0;
  *(undefined8 *)((long)&(This->accu_p).field_0 + 8) = 0;
  This->g_subdiv_mode = false;
  *(undefined8 *)&(This->hair_K).field_0 = 0x3f11eb853f4ccccd;
  *(undefined8 *)((long)&(This->hair_K).field_0 + 8) = 0x3ea3d70a;
  *(undefined8 *)&(This->hair_dK).field_0 = 0x3df5c28f3dcccccd;
  *(undefined8 *)((long)&(This->hair_dK).field_0 + 8) = 0x3da3d70a;
  *(undefined8 *)&(This->hair_Kr).field_0 = 0x3de978d53e23d70b;
  *(undefined8 *)((long)&(This->hair_Kr).field_0 + 8) = 0x3d83126f;
  *(undefined8 *)&(This->hair_Kt).field_0 = 0x3ee978d53f23d70b;
  *(undefined8 *)((long)&(This->hair_Kt).field_0 + 8) = 0x3e83126f;
  return;
}

Assistant:

void TutorialData_Constructor(TutorialData* This)
{
  This->scene = nullptr;
  This->traversable = nullptr;
  This->ispc_scene = g_ispc_scene;
  This->dirlight_direction = Vec3fa(g_dirlight_direction);
  This->dirlight_intensity = Vec3fa(g_dirlight_intensity);
  This->ambient_intensity = Vec3fa(g_ambient_intensity);
  This->accu = nullptr;
  This->accu_width = 0;
  This->accu_height = 0;
  This->accu_count = 0;
  This->g_subdiv_mode = false;
  
  /* initialize last seen camera */
  This->accu_vx = Vec3fa(0.0f);
  This->accu_vy = Vec3fa(0.0f);
  This->accu_vz = Vec3fa(0.0f);
  This->accu_p  = Vec3fa(0.0f);

  /* initialize hair colors */
  This->hair_K  = Vec3fa(0.8f,0.57f,0.32f);
  This->hair_dK = Vec3fa(0.1f,0.12f,0.08f);
  This->hair_Kr = 0.2f*This->hair_K;    //!< reflectivity of hair
  This->hair_Kt = 0.8f*This->hair_K;    //!< transparency of hair
}